

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O0

void __thiscall interface::parse_communication_parameters(interface *this,string *parameters)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  unsigned_long uVar4;
  invalid_argument *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string_type local_188;
  type local_164;
  string_type local_160;
  type local_13c;
  string_type local_138;
  character_size local_114;
  string_type local_110;
  type local_ec;
  string_type local_e8;
  type local_c4;
  string_type local_c0;
  character_size local_9c;
  string_type local_98;
  baud_rate local_74;
  string_type local_70;
  baud_rate local_4c;
  undefined1 local_48 [8];
  smatch match;
  string *parameters_local;
  interface *this_local;
  
  if ((parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                   baud_rate_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_abi_cxx11_,
               "^(\\d+)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                         baud_rate_abi_cxx11_);
  }
  if ((parse_communication_parameters(std::__cxx11::string_const&)::baud_rate_and_params_abi_cxx11_
       == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                   baud_rate_and_params_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_communication_parameters(std::__cxx11::string_const&)::
                baud_rate_and_params_abi_cxx11_,"^(\\d+)\\,([78])([noeNOE])(1\\.5|1|2)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_communication_parameters(std::__cxx11::string_const&)::
                  baud_rate_and_params_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                         baud_rate_and_params_abi_cxx11_);
  }
  if ((parse_communication_parameters(std::__cxx11::string_const&)::params_only_abi_cxx11_ == '\0')
     && (iVar2 = __cxa_guard_acquire(&parse_communication_parameters(std::__cxx11::string_const&)::
                                      params_only_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_communication_parameters(std::__cxx11::string_const&)::params_only_abi_cxx11_,
               "([78])([noeNOE])(1\\.5|1|2))",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_communication_parameters(std::__cxx11::string_const&)::
                  params_only_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_communication_parameters(std::__cxx11::string_const&)::
                         params_only_abi_cxx11_);
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_48);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (parameters,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_48,
                     &parse_communication_parameters(std::__cxx11::string_const&)::
                      baud_rate_abi_cxx11_,0);
  if (bVar1) {
    pvVar3 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_48,1);
    std::__cxx11::sub_match::operator_cast_to_string(&local_70,(sub_match *)pvVar3);
    uVar4 = std::__cxx11::stoul(&local_70,(size_t *)0x0,10);
    boost::asio::serial_port_base::baud_rate::baud_rate(&local_4c,(uint)uVar4);
    (this->baud_rate_).value_ = local_4c.value_;
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (parameters,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_48,
                       &parse_communication_parameters(std::__cxx11::string_const&)::
                        baud_rate_and_params_abi_cxx11_,0);
    if (bVar1) {
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_98,(sub_match *)pvVar3);
      uVar4 = std::__cxx11::stoul(&local_98,(size_t *)0x0,10);
      boost::asio::serial_port_base::baud_rate::baud_rate(&local_74,(uint)uVar4);
      (this->baud_rate_).value_ = local_74.value_;
      std::__cxx11::string::~string((string *)&local_98);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_c0,(sub_match *)pvVar3);
      uVar4 = std::__cxx11::stoul(&local_c0,(size_t *)0x0,10);
      boost::asio::serial_port_base::character_size::character_size(&local_9c,(uint)uVar4);
      (this->character_size_).value_ = local_9c.value_;
      std::__cxx11::string::~string((string *)&local_c0);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,3);
      std::__cxx11::sub_match::operator_cast_to_string(&local_e8,(sub_match *)pvVar3);
      local_c4 = (type)parity_from_text(&local_e8);
      (this->parity_).value_ = local_c4;
      std::__cxx11::string::~string((string *)&local_e8);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,4);
      std::__cxx11::sub_match::operator_cast_to_string(&local_110,(sub_match *)pvVar3);
      local_ec = (type)stop_bits_from_text(&local_110);
      (this->stop_bits_).value_ = local_ec;
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (parameters,
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_48,
                         &parse_communication_parameters(std::__cxx11::string_const&)::
                          params_only_abi_cxx11_,0);
      if (!bVar1) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_1c8,"unable to parse communication parameters: \"",parameters);
        std::operator+(&local_1a8,&local_1c8,"\"");
        std::invalid_argument::invalid_argument(this_00,(string *)&local_1a8);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_138,(sub_match *)pvVar3);
      uVar4 = std::__cxx11::stoul(&local_138,(size_t *)0x0,10);
      boost::asio::serial_port_base::character_size::character_size(&local_114,(uint)uVar4);
      (this->character_size_).value_ = local_114.value_;
      std::__cxx11::string::~string((string *)&local_138);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,2);
      std::__cxx11::sub_match::operator_cast_to_string(&local_160,(sub_match *)pvVar3);
      local_13c = (type)parity_from_text(&local_160);
      (this->parity_).value_ = local_13c;
      std::__cxx11::string::~string((string *)&local_160);
      pvVar3 = std::__cxx11::
               match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)local_48,3);
      std::__cxx11::sub_match::operator_cast_to_string(&local_188,(sub_match *)pvVar3);
      local_164 = (type)stop_bits_from_text(&local_188);
      (this->stop_bits_).value_ = local_164;
      std::__cxx11::string::~string((string *)&local_188);
    }
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_48);
  return;
}

Assistant:

void interface::parse_communication_parameters( const std::string& parameters )
{
    static const std::regex baud_rate( "^(\\d+)" );
    static const std::regex baud_rate_and_params( "^(\\d+)\\,([78])([noeNOE])(1\\.5|1|2)" );
    static const std::regex params_only( "([78])([noeNOE])(1\\.5|1|2))" );

    std::smatch match;
    if ( std::regex_match( parameters, match, baud_rate ) )
    {
        baud_rate_ = boost::asio::serial_port_base::baud_rate( stoul( match[ 1 ] ) );
    }
    else if ( std::regex_match( parameters, match, baud_rate_and_params ) )
    {
        baud_rate_      = boost::asio::serial_port_base::baud_rate( stoul( match[ 1 ] ) );
        character_size_ = boost::asio::serial_port_base::character_size( stoul( match[ 2 ] ) );
        parity_         = parity_from_text( match[ 3 ] );
        stop_bits_      = stop_bits_from_text( match[ 4 ] );
    }
    else if ( std::regex_match( parameters, match, params_only ) )
    {
        character_size_ = boost::asio::serial_port_base::character_size( stoul( match[ 1 ] ) );
        parity_         = parity_from_text( match[ 2 ] );
        stop_bits_      = stop_bits_from_text( match[ 3 ] );
    }
    else
    {
        throw std::invalid_argument( "unable to parse communication parameters: \"" + parameters + "\"" );
    }
}